

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Particle.h
# Opt level: O2

void __thiscall
pica::Particle<(pica::Dimension)2>::setVelocity
          (Particle<(pica::Dimension)2> *this,MomentumType *newVelocity)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  
  dVar2 = 8.987551787368177e+20 -
          (newVelocity->z * newVelocity->z +
          newVelocity->x * newVelocity->x + newVelocity->y * newVelocity->y);
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  dVar3 = newVelocity->z / dVar2;
  auVar4._0_8_ = newVelocity->x;
  auVar4._8_8_ = newVelocity->y;
  auVar1._8_8_ = dVar2;
  auVar1._0_8_ = dVar2;
  auVar4 = divpd(auVar4,auVar1);
  (this->p).x = (double)auVar4._0_8_;
  (this->p).y = (double)auVar4._8_8_;
  (this->p).z = dVar3;
  this->invGamma =
       1.0 / SQRT(dVar3 * dVar3 + auVar4._0_8_ * auVar4._0_8_ + auVar4._8_8_ * auVar4._8_8_ + 1.0);
  return;
}

Assistant:

void setVelocity(const MomentumType& newVelocity)
    {
        p = newVelocity / sqrt(constants::c * constants::c - newVelocity.norm2());
        invGamma = (FP)1 / sqrt((FP)1 + p.norm2());
    }